

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void __thiscall
wasm::Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::doWalkModule
          (Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> *this,
          Module *module)

{
  Table *pTVar1;
  long lVar2;
  undefined8 *puVar3;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *curr;
  long lVar4;
  undefined8 *puVar5;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range2;
  unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_> *curr_7;
  
  pTVar1 = (Table *)(this[-1].stack.fixed._M_elems + 7);
  lVar2 = *(long *)(module + 8);
  for (lVar4 = *(long *)module; lVar4 != lVar2; lVar4 = lVar4 + 8) {
    wasm::ReFinalize::visitExport((Export *)pTVar1);
  }
  puVar3 = *(undefined8 **)(module + 0x38);
  for (puVar5 = *(undefined8 **)(module + 0x30); puVar5 != puVar3; puVar5 = puVar5 + 1) {
    if ((((Global *)*puVar5)->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
      walkGlobal(this,(Global *)*puVar5);
    }
    else {
      wasm::ReFinalize::visitGlobal((Global *)pTVar1);
    }
  }
  puVar3 = *(undefined8 **)(module + 0x20);
  for (puVar5 = *(undefined8 **)(module + 0x18); puVar5 != puVar3; puVar5 = puVar5 + 1) {
    if ((((Function *)*puVar5)->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
      walkFunction(this,(Function *)*puVar5);
    }
  }
  lVar2 = *(long *)(module + 0x50);
  for (lVar4 = *(long *)(module + 0x48); lVar4 != lVar2; lVar4 = lVar4 + 8) {
    wasm::ReFinalize::visitTag((Tag *)pTVar1);
  }
  puVar3 = *(undefined8 **)(module + 0x68);
  for (puVar5 = *(undefined8 **)(module + 0x60); puVar5 != puVar3; puVar5 = puVar5 + 1) {
    walkElementSegment(this,(ElementSegment *)*puVar5);
  }
  lVar2 = *(long *)(module + 0xb0);
  for (lVar4 = *(long *)(module + 0xa8); lVar4 != lVar2; lVar4 = lVar4 + 8) {
    wasm::ReFinalize::visitTable(pTVar1);
  }
  puVar3 = *(undefined8 **)(module + 0x98);
  for (puVar5 = *(undefined8 **)(module + 0x90); puVar5 != puVar3; puVar5 = puVar5 + 1) {
    walkDataSegment(this,(DataSegment *)*puVar5);
  }
  lVar2 = *(long *)(module + 0x80);
  for (lVar4 = *(long *)(module + 0x78); lVar4 != lVar2; lVar4 = lVar4 + 8) {
    wasm::ReFinalize::visitMemory((Memory *)pTVar1);
  }
  return;
}

Assistant:

void doWalkModule(Module* module) {
    // Dispatch statically through the SubType.
    SubType* self = static_cast<SubType*>(this);
    for (auto& curr : module->exports) {
      self->visitExport(curr.get());
    }
    for (auto& curr : module->globals) {
      if (curr->imported()) {
        self->visitGlobal(curr.get());
      } else {
        self->walkGlobal(curr.get());
      }
    }
    for (auto& curr : module->functions) {
      if (curr->imported()) {
        self->visitFunction(curr.get());
      } else {
        self->walkFunction(curr.get());
      }
    }
    for (auto& curr : module->tags) {
      if (curr->imported()) {
        self->visitTag(curr.get());
      } else {
        self->walkTag(curr.get());
      }
    }
    for (auto& curr : module->elementSegments) {
      self->walkElementSegment(curr.get());
    }
    for (auto& curr : module->tables) {
      self->walkTable(curr.get());
    }
    for (auto& curr : module->dataSegments) {
      self->walkDataSegment(curr.get());
    }
    for (auto& curr : module->memories) {
      self->walkMemory(curr.get());
    }
  }